

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O1

void * os_banner_create(void *parent,int where,void *other,int wintype,int align,int siz,
                       int siz_units,unsigned_long style)

{
  uint *puVar1;
  size_t __size;
  int iVar2;
  osgen_txtwin_t *win;
  char *__s;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  
  iVar2 = G_oss_screen_width;
  if (os_f_plain != 0) {
    return (void *)0x0;
  }
  if (parent == (void *)0x0) {
    parent = S_main_win;
  }
  if (wintype == 2) {
    lVar6 = (long)G_oss_screen_width;
    win = (osgen_txtwin_t *)osgen_create_win(2,where,other,(osgen_win_t *)parent);
    if (win != (osgen_txtwin_t *)0x0) {
      win->solfg = (int)lVar6;
      win->solbg = (int)((ulong)lVar6 >> 0x20);
      *(undefined8 *)&win->solattr = 10;
      __size = lVar6 * 10;
      __s = (char *)malloc(__size);
      win->txtbuf = __s;
      pvVar3 = malloc(lVar6 * 0x14);
      win->txtbufsiz = (size_t)pvVar3;
      if (__s != (char *)0x0 && pvVar3 != (void *)0x0) {
        if (iVar2 != 0) {
          memset(__s,0x20,__size);
          sVar4 = 0;
          do {
            *(undefined2 *)((long)pvVar3 + sVar4 * 2) = 0x102;
            sVar4 = sVar4 + 1;
          } while (__size != sVar4);
        }
        goto LAB_001eb9de;
      }
      osgen_delete_win((osgen_win_t *)win);
    }
    win = (osgen_txtwin_t *)0x0;
  }
  else {
    if (wintype != 1) {
      return (void *)0x0;
    }
    win = osgen_create_txtwin(where,other,parent,G_oss_screen_width * G_oss_screen_height * 2,
                              G_oss_screen_height * 2);
  }
LAB_001eb9de:
  if (win == (osgen_txtwin_t *)0x0) {
    return (void *)0x0;
  }
  (win->base).alignment = align;
  if ((align & 0xfffffffeU) == 2) {
    (win->base).wid = 0;
    if (S_main_win == (osgen_txtwin_t *)0x0) {
      sVar5 = (size_t)G_oss_screen_height;
    }
    else {
      sVar5 = (S_main_win->base).ht;
    }
  }
  else {
    if (S_main_win == (osgen_txtwin_t *)0x0) {
      sVar5 = (size_t)G_oss_screen_width;
    }
    else {
      sVar5 = (S_main_win->base).wid;
    }
    (win->base).wid = sVar5;
    sVar5 = 0;
  }
  (win->base).ht = sVar5;
  if ((style & 8) != 0) {
    puVar1 = &(win->base).flags;
    *(byte *)puVar1 = (byte)*puVar1 | 1;
  }
  if ((style & 0x40) != 0) {
    puVar1 = &(win->base).flags;
    *(byte *)puVar1 = (byte)*puVar1 | 9;
  }
  if (((uint)style >> 8 & 1) != 0) {
    puVar1 = &(win->base).flags;
    *(byte *)puVar1 = (byte)*puVar1 | 0x10;
  }
  if ((char)style < '\0') {
    puVar1 = &(win->base).flags;
    *(byte *)puVar1 = (byte)*puVar1 | 0x20;
  }
  (win->base).size = siz;
  (win->base).size_type = siz_units;
  if (siz != 0) {
    osgen_recalc_layout();
    return win;
  }
  return win;
}

Assistant:

void *os_banner_create(void *parent, int where, void *other, int wintype,
                       int align, int siz, int siz_units, unsigned long style)
{
    osgen_win_t *win;

    /* we don't support banners in plain mode */
    if (os_f_plain)
        return 0;

    /* if the parent is null, it means that it's a child of the main window */
    if (parent == 0)
        parent = &S_main_win->base;

    /* check for a supported window type */
    switch(wintype)
    {
    case OS_BANNER_TYPE_TEXT:
        /* 
         *   Create a text window.  We don't support scrollback in the UI in
         *   banner windows, so we only need enough for what's on the screen
         *   for redrawing.  Overallocate by a bit, though, to be safe in
         *   case the screen grows later.  
         */
        win = (osgen_win_t *)osgen_create_txtwin(where, other, parent,
            G_oss_screen_height * G_oss_screen_width * 2,
            G_oss_screen_height * 2);
        break;

    case OS_BANNER_TYPE_TEXTGRID:
        /*
         *   Create a text grid window.  Make it ten lines high at the
         *   current screen width; we'll automatically expand this
         *   allocation as needed later, so this size doesn't have to be a
         *   perfect guess; but the closer we get the better, as it's more
         *   efficient to avoid reallocating if possible.  
         */
        win = (osgen_win_t *)osgen_create_gridwin(where, other, parent,
            G_oss_screen_width, 10);
        break;

    default:
        /* unsupported type - return failure */
        return 0;
    }
    
    /* if that failed, return null */
    if (win == 0)
        return 0;

    /* set the alignment */
    win->alignment = align;

    /*
     *   Start out width a zero size in the settable dimension, and the
     *   current main text area size in the constrained dimension. 
     */
    if (align == OS_BANNER_ALIGN_LEFT || align == OS_BANNER_ALIGN_RIGHT)
    {
        /* the width is the settable dimension for a left/right banner */
        win->wid = 0;
        win->ht = (S_main_win != 0
                   ? S_main_win->base.ht : G_oss_screen_height);
    }
    else
    {
        /* the height is the settable dimension for a top/bottom banner */
        win->wid = (S_main_win != 0
                    ? S_main_win->base.wid : G_oss_screen_width);
        win->ht = 0;
    }

    /* set auto-vscroll mode if they want it */
    if ((style & OS_BANNER_STYLE_AUTO_VSCROLL) != 0)
        win->flags |= OSGEN_AUTO_VSCROLL;

    /* 
     *   Note the MORE mode style, if specified.  MORE mode implies
     *   auto-vscroll, so add that style as well if MORE mode is requested.  
     */
    if ((style & OS_BANNER_STYLE_MOREMODE) != 0)
        win->flags |= OSGEN_AUTO_VSCROLL | OSGEN_MOREMODE;

    /* note the "strut" style flags, if specified */
    if ((style & OS_BANNER_STYLE_VSTRUT) != 0)
        win->flags |= OSGEN_VSTRUT;
    if ((style & OS_BANNER_STYLE_HSTRUT) != 0)
        win->flags |= OSGEN_HSTRUT;

    /* remember the requested size */
    win->size = siz;
    win->size_type = siz_units;

    /* 
     *   if the window has a non-zero size, recalculate the layout; if the
     *   size is zero, we don't have to bother, since the layout won't affect
     *   anything on the display 
     */
    if (siz != 0)
        osgen_recalc_layout();

    /* return the window */
    return win;
}